

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O3

void * QArrayData::allocate2(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  size_t sVar1;
  QArrayData *pQVar2;
  void *pvVar3;
  size_t __size;
  CalculateGrowingBlockSizeResult CVar4;
  
  if (capacity != 0) {
    if (option == Grow) {
      CVar4 = qCalculateGrowingBlockSize(capacity,2,0x12);
      capacity = CVar4.elementCount;
      __size = CVar4.size;
LAB_00105b9b:
      if (-1 < (long)__size) {
        pQVar2 = (QArrayData *)malloc(__size);
        if (pQVar2 != (QArrayData *)0x0) {
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i = 1;
          (pQVar2->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
          super_QFlagsStorage<QArrayData::ArrayOption>.i = 0;
          pvVar3 = (void *)((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0);
          pQVar2->alloc = capacity;
          goto LAB_00105bc9;
        }
      }
    }
    else if (-1 < capacity) {
      sVar1 = capacity * 2 + 0x12;
      if ((ulong)(capacity * 2) < 0xffffffffffffffee) {
        __size = 0xffffffffffffffff;
        if (-1 < (long)sVar1) {
          __size = sVar1;
        }
        goto LAB_00105b9b;
      }
    }
  }
  pvVar3 = (void *)0x0;
  pQVar2 = (QArrayData *)0x0;
LAB_00105bc9:
  *dptr = pQVar2;
  return pvVar3;
}

Assistant:

void *QArrayData::allocate2(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(2, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}